

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * el::base::utils::Str::replaceAll(string *str,string *replaceWhat,string *replaceWith)

{
  __type _Var1;
  ulong uVar2;
  string *psVar3;
  size_t foundAt;
  string *replaceWith_local;
  string *replaceWhat_local;
  string *str_local;
  
  _Var1 = ::std::operator==(replaceWhat,replaceWith);
  if (!_Var1) {
    while (uVar2 = ::std::__cxx11::string::find((string *)str,(ulong)replaceWhat),
          uVar2 != 0xffffffffffffffff) {
      psVar3 = (string *)::std::__cxx11::string::length();
      ::std::__cxx11::string::replace((ulong)str,uVar2,psVar3);
    }
  }
  return str;
}

Assistant:

std::string& Str::replaceAll(std::string& str, const std::string& replaceWhat,
                             const std::string& replaceWith) {
  if (replaceWhat == replaceWith)
    return str;
  std::size_t foundAt = std::string::npos;
  while ((foundAt = str.find(replaceWhat, foundAt + 1)) != std::string::npos) {
    str.replace(foundAt, replaceWhat.length(), replaceWith);
  }
  return str;
}